

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslserver.cpp
# Opt level: O0

void __thiscall QSslServerPrivate::removeSocketData(QSslServerPrivate *this,quintptr socket)

{
  bool bVar1;
  iterator *in_RDI;
  long in_FS_OFFSET;
  piter in_stack_00000000;
  iterator it;
  unsigned_long_long *in_stack_ffffffffffffff98;
  iterator *in_stack_ffffffffffffffa8;
  iterator *this_00;
  SocketData *in_stack_ffffffffffffffc8;
  piter local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.bucket = 0xaaaaaaaaaaaaaaaa;
  local_20.d = (Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *)
               0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  local_20 = (piter)QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::find
                              ((QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *)in_RDI,
                               in_stack_ffffffffffffff98);
  QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::end
            ((QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *)in_stack_ffffffffffffffa8);
  bVar1 = QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::iterator::operator!=
                    (in_stack_ffffffffffffffa8,in_RDI);
  if (bVar1) {
    QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::iterator::operator->
              ((iterator *)0x3b1727);
    SocketData::disconnectSignals(in_stack_ffffffffffffffc8);
    QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::const_iterator::const_iterator
              ((const_iterator *)&stack0xffffffffffffffc0,(iterator *)&local_20);
    QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::erase
              ((QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *)this_00,
               (const_iterator)in_stack_00000000);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSslServerPrivate::removeSocketData(quintptr socket)
{
    auto it = socketData.find(socket);
    if (it != socketData.end()) {
        it->disconnectSignals();
        socketData.erase(it);
    }
}